

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Payload>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *result)

{
  bool bVar1;
  allocator local_2b9;
  string local_2b8;
  undefined1 local_298 [8];
  Payload value_1;
  int local_170;
  char nc;
  char c;
  string local_168;
  undefined1 local_148 [8];
  Payload value;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *result_local;
  char end_symbol_local;
  char sep_local;
  AsciiParser *this_local;
  
  value.layerOffset._scale = (double)result;
  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(result);
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (bVar1) {
    Payload::Payload((Payload *)local_148);
    bVar1 = ReadBasicType(this,(Payload *)local_148);
    if (bVar1) {
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                 value.layerOffset._scale,(value_type *)local_148);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_168,"Not starting with the value of requested type.\n",
                 (allocator *)&c);
      PushError(this,&local_168);
      ::std::__cxx11::string::~string((string *)&local_168);
      ::std::allocator<char>::~allocator((allocator<char> *)&c);
      this_local._7_1_ = 0;
    }
    Payload::~Payload((Payload *)local_148);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005b2fff;
        }
        bVar1 = Char1(this,(char *)((long)&value_1.layerOffset._scale + 7));
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005b2fff;
        }
        if (value_1.layerOffset._scale._7_1_ == sep) {
          bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005b2fff;
          }
          bVar1 = LookChar1(this,(char *)((long)&value_1.layerOffset._scale + 6));
          if (!bVar1) {
            this_local._7_1_ = 0;
            goto LAB_005b2fff;
          }
          if (value_1.layerOffset._scale._6_1_ == end_symbol) break;
        }
        if (value_1.layerOffset._scale._7_1_ != sep) {
          StreamReader::seek_from_current(this->_sr,-1);
          break;
        }
        bVar1 = SkipWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_005b2fff;
        }
        Payload::Payload((Payload *)local_298);
        bVar1 = ReadBasicType(this,(Payload *)local_298);
        if (bVar1) {
          ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                    ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                     value.layerOffset._scale,(value_type *)local_298);
          local_170 = 0;
        }
        else {
          local_170 = 3;
        }
        Payload::~Payload((Payload *)local_298);
      } while (local_170 == 0);
      bVar1 = ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::empty
                        ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                         value.layerOffset._scale);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2b8,"Empty array.\n",&local_2b9);
        PushError(this,&local_2b8);
        ::std::__cxx11::string::~string((string *)&local_2b8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_005b2fff:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}